

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18fa793::Target::AddBacktrace(Target *this,Value *object,cmListFileBacktrace *bt)

{
  JBTIndex value;
  Value *this_00;
  Value local_30;
  
  value = BacktraceData::Add(&this->Backtraces,bt);
  if (value.Index != 0xffffffff) {
    Json::Value::Value(&local_30,value.Index);
    this_00 = Json::Value::operator[](object,"backtrace");
    Json::Value::operator=(this_00,&local_30);
    Json::Value::~Value(&local_30);
  }
  return;
}

Assistant:

void Target::AddBacktrace(Json::Value& object, cmListFileBacktrace const& bt)
{
  if (JBTIndex backtrace = this->Backtraces.Add(bt)) {
    object["backtrace"] = backtrace.Index;
  }
}